

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError StartStream(PaStream *s)

{
  PaError PVar1;
  int in_ESI;
  char *format;
  
  PaUtil_ResetBufferProcessor((PaUtilBufferProcessor *)((long)s + 0x68));
  *(undefined4 *)((long)s + 0x244) = 1;
  if (*(int *)((long)s + 0x224) == 0) {
    paUtilErr_ = AlsaStart((PaAlsaStream *)s,in_ESI);
    if (-1 < paUtilErr_) {
      return 0;
    }
    format = 
    "Expression \'AlsaStart( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3064\n"
    ;
  }
  else {
    paUtilErr_ = PaUnixThread_New((PaUnixThread *)((long)s + 0x198),CallbackThreadFunc,s,1.0,
                                  *(int *)((long)s + 0x22c));
    if (-1 < paUtilErr_) {
      return 0;
    }
    format = 
    "Expression \'PaUnixThread_New( &stream->thread, &CallbackThreadFunc, stream, 1., stream->rtSched )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3060\n"
    ;
  }
  PaUtil_DebugPrint(format);
  PVar1 = paUtilErr_;
  *(undefined4 *)((long)s + 0x244) = 0;
  return PVar1;
}

Assistant:

static PaError StartStream( PaStream *s )
{
    PaError result = paNoError;
    PaAlsaStream* stream = (PaAlsaStream*)s;
    int streamStarted = 0;  /* So we can know whether we need to take the stream down */

    /* Ready the processor */
    PaUtil_ResetBufferProcessor( &stream->bufferProcessor );

    /* Set now, so we can test for activity further down */
    stream->isActive = 1;

    if( stream->callbackMode )
    {
        PA_ENSURE( PaUnixThread_New( &stream->thread, &CallbackThreadFunc, stream, 1., stream->rtSched ) );
    }
    else
    {
        PA_ENSURE( AlsaStart( stream, 0 ) );
        streamStarted = 1;
    }

end:
    return result;
error:
    if( streamStarted )
    {
        AbortStream( stream );
    }
    stream->isActive = 0;

    goto end;
}